

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADRender.cpp
# Opt level: O1

void adaptive_distributed_render_scene
               (Scene *scene,double HalfWidth,double HalfHeight,int nx,int ny,int nxSub,int nySub,
               double Variance,char *PicFileName)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  TargaImage *this;
  int iVar8;
  int iVar9;
  int jSub;
  int iVar10;
  int iVar11;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar12;
  double dVar13;
  double dVar14;
  Ray ray;
  int local_154;
  double local_150;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  undefined8 uStack_110;
  Color local_a0;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  Ray local_60;
  
  auVar1._8_4_ = in_XMM0_Dc;
  auVar1._0_8_ = HalfWidth;
  auVar1._12_4_ = in_XMM0_Dd;
  this = (TargaImage *)operator_new(0x40);
  TargaImage::TargaImage(this,PicFileName,nx,ny,(char *)0x0);
  if (0 < ny) {
    uStack_110 = auVar1._8_8_;
    local_88 = (HalfWidth + HalfWidth) / (double)nx;
    dVar13 = (HalfHeight + HalfHeight) / (double)ny;
    local_78 = local_88 / (double)nxSub;
    uStack_70 = uStack_110;
    local_154 = 0;
    iVar8 = 0;
    if (0 < nySub) {
      iVar8 = nySub;
    }
    uStack_80 = uStack_110;
    dVar2 = local_88 * -0.5;
    local_150 = HalfHeight;
    do {
      if (0 < nx) {
        iVar6 = 0;
        dVar3 = -HalfWidth;
        do {
          TotalPixels = TotalPixels + 1;
          local_128 = 0.0;
          local_130 = 0.0;
          local_138 = 0.0;
          iVar9 = 0;
          local_140 = 0.0;
          do {
            if (0 < nxSub) {
              iVar9 = iVar9 + iVar8 * nxSub;
              iVar11 = 0;
              do {
                if (0 < nySub) {
                  iVar10 = 0;
                  do {
                    iVar7 = rand();
                    dVar4 = ((double)iVar7 / 2147483647.0 + (double)iVar11) * local_78;
                    iVar7 = rand();
                    Scene::camera(scene,dVar4 + dVar2 + dVar3,
                                  ((double)iVar7 / 2147483647.0 + (double)iVar10) *
                                  (dVar13 / (double)nySub) + dVar13 * -0.5 + local_150,&local_60);
                    Scene::trace(&local_a0,scene,&Grayzer::Medium::air,1.0,&local_60);
                    local_128 = local_128 + local_a0.x;
                    local_130 = local_130 + local_a0.y;
                    local_138 = local_138 + local_a0.z;
                    local_140 = local_140 +
                                local_a0.z * local_a0.z +
                                local_a0.x * local_a0.x + local_a0.y * local_a0.y;
                    iVar10 = iVar10 + 1;
                  } while (nySub != iVar10);
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 != nxSub);
            }
            dVar14 = (double)iVar9;
            dVar12 = local_128 / dVar14;
            dVar5 = local_130 / dVar14;
            dVar4 = local_138 / dVar14;
          } while ((Variance <=
                    (((local_140 / dVar14 - (dVar4 * dVar4 + dVar12 * dVar12 + dVar5 * dVar5)) *
                     dVar14) / (double)(iVar9 + -1)) / dVar14) && (iVar9 < 99));
          (*(this->super_Image)._vptr_Image[3])
                    (this,(ulong)((int)(dVar12 * 255.0) & 0xffU |
                                 ((int)(dVar5 * 255.0) & 0xffU) << 8 | (int)(dVar4 * 255.0) << 0x10)
                    );
          iVar6 = iVar6 + 1;
          dVar3 = dVar3 + local_88;
        } while (iVar6 != nx);
      }
      local_154 = local_154 + 1;
      local_150 = local_150 - dVar13;
    } while (local_154 != ny);
  }
  (*(this->super_Image)._vptr_Image[1])();
  return;
}

Assistant:

void adaptive_distributed_render_scene(
   Scene* scene,
   double HalfWidth,double HalfHeight,
   int   nx,int ny,int nxSub,int nySub,
   double Variance,
   char const*PicFileName)
{
   double x,y;                // sample point
   Ray   ray;                 // pixel ray
   double hx = 2.0   * HalfWidth / nx;   // pixel width
   double hy = 2.0   * HalfHeight / ny;     // pixel height
   double hxSub = hx /  nxSub;
   double hySub = hy /  nySub;
   double Disp;               // dispersion squared
   int   i,j;
   Vector Color;
   Vector Sum;
   Vector Mean;
   int   Count;

   auto tga = std::make_unique<TargaImage>(PicFileName, nx, ny);
   rgb   c;

   for(i = 0, y = HalfHeight; i < ny; i++, y -= hy)
   {
      for(j = 0, x = -HalfWidth; j < nx; j++, x += hx)
      {
         double x1 = x - 0.5 * hx;
         double y1 = y - 0.5 * hy;
         double d;

         Sum   = 0;
         Disp  = 0;
         Count = 0;

         TotalPixels++;

         do {
            for(int  iSub = 0; iSub < nxSub; iSub++)
            {
               for(int  jSub = 0; jSub < nySub; jSub++)
               {
                  scene->camera(x1+hxSub*(iSub+rnd()),y1+hySub*(jSub+rnd()),ray);
                  Color = scene->trace( Grayzer::Medium::air, 1.0, ray );
                  Sum  += Color;
                  Disp += Color & Color;
                  Count++;
               }
            }
            Mean = Sum / Count;
            d =   (Disp /  Count -  (Mean &  Mean)) * Count / (Count - 1);
         } while(d / Count >= Variance && Count < 99);

         clip( Mean );
         c.r   = Mean.x * 255;
         c.g   = Mean.y * 255;
         c.b   = Mean.z * 255;

         tga->put_pixel(c);
      }
   }
}